

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O3

void __thiscall cppnet::Dispatcher::Connect(Dispatcher *this,string *ip,uint16_t port)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pthread_t pVar3;
  string *psVar4;
  anon_class_48_3_02cd77fa task;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  anon_class_48_3_02cd77fa local_50;
  
  paVar1 = &local_50.ip.field_2;
  pcVar2 = (ip->_M_dataplus)._M_p;
  local_50.ip._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + ip->_M_string_length);
  local_50.port = port;
  local_50.this = this;
  pVar3 = pthread_self();
  if (pVar3 == (this->_local_thread_id)._M_thread) {
    Connect::anon_class_48_3_02cd77fa::operator()(&local_50);
  }
  else {
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    psVar4 = (string *)operator_new(0x30);
    *(string **)psVar4 = psVar4 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              (psVar4,local_50.ip._M_dataplus._M_p,
               local_50.ip._M_dataplus._M_p + local_50.ip._M_string_length);
    *(ulong *)(psVar4 + 0x20) = CONCAT62(local_50._34_6_,local_50.port);
    *(Dispatcher **)(psVar4 + 0x28) = local_50.this;
    pcStack_60 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:107:17)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:107:17)>
               ::_M_manager;
    local_78._M_unused._0_8_ = (undefined8)psVar4;
    PostTask(this,(Task *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.ip._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.ip._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Dispatcher::Connect(const std::string& ip, uint16_t port) {
    auto task = [ip, port, this]() {
        auto sock = MakeRWSocket();
        sock->SetDispatcher(shared_from_this());
        sock->SetEventActions(_event_actions);
        sock->SetCppNetBase(_cppnet_base.lock());
        sock->Connect(ip, port);
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}